

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O1

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy
               (string *tgtName,cmMessenger *messenger,cmListFileBacktrace *context)

{
  bool bVar1;
  PolicyStatus PVar2;
  size_t sVar3;
  ostream *poVar4;
  PolicyID id;
  bool bVar5;
  MessageType t;
  char *__s;
  ostringstream e;
  undefined1 local_1d0 [32];
  cmMessenger *local_1b0;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  cmListFileBacktrace::GetBottom((cmStateSnapshot *)local_1d0,context);
  t = AUTHOR_WARNING;
  PVar2 = cmStateSnapshot::GetPolicy((cmStateSnapshot *)local_1d0,CMP0026,false);
  local_1b0 = messenger;
  if (PVar2 - NEW < 3) {
    t = FATAL_ERROR;
    __s = "may";
    bVar1 = false;
    bVar5 = false;
  }
  else {
    bVar5 = true;
    if (PVar2 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1d0,(cmPolicies *)0x1a,id);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_1d0._0_8_,local_1d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((cmState *)local_1d0._0_8_ != (cmState *)(local_1d0 + 0x10)) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      bVar1 = false;
      __s = "should";
      t = AUTHOR_WARNING;
    }
    else {
      bVar1 = true;
      __s = (char *)0x0;
    }
  }
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The LOCATION property ",0x16);
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," not be read from target \"",0x1a);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(tgtName->_M_dataplus)._M_p,tgtName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
               ,0x7a);
    std::__cxx11::stringbuf::str();
    cmMessenger::IssueMessage(local_1b0,t,(string *)local_1d0,context);
    if ((cmState *)local_1d0._0_8_ != (cmState *)(local_1d0 + 0x10)) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return bVar5;
}

Assistant:

bool cmTargetPropertyComputer::HandleLocationPropertyPolicy(
  std::string const& tgtName, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  std::ostringstream e;
  const char* modal = nullptr;
  MessageType messageType = MessageType::AUTHOR_WARNING;
  switch (context.GetBottom().GetPolicy(cmPolicies::CMP0026)) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = MessageType::FATAL_ERROR;
  }

  if (modal) {
    e << "The LOCATION property " << modal << " not be read from target \""
      << tgtName
      << "\".  Use the target name directly with "
         "add_custom_command, or use the generator expression $<TARGET_FILE>, "
         "as appropriate.\n";
    messenger->IssueMessage(messageType, e.str(), context);
  }

  return messageType != MessageType::FATAL_ERROR;
}